

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

void __thiscall DataRefs::SetViewType(DataRefs *this,XPViewTypes vt)

{
  long lVar1;
  mapViewTypesTy *pmVar2;
  long lVar3;
  bool bVar4;
  
  if (MAP_VIEW_TYPES[0].e == vt) {
    pmVar2 = MAP_VIEW_TYPES;
    bVar4 = false;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      bVar4 = lVar3 == 0x58;
      if (bVar4) goto LAB_00130394;
      lVar1 = lVar3 + 8;
    } while (*(XPViewTypes *)((long)&MAP_VIEW_TYPES[1].e + lVar3) != vt);
    pmVar2 = (mapViewTypesTy *)(lVar3 + 0x2e2088);
  }
  XPLMCommandOnce(this->cmdXP[pmVar2->cr]);
LAB_00130394:
  if ((bVar4) && ((int)dataRefs.iLogLevel < 3)) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
           ,0x46d,"SetViewType",logWARN,"Didn\'t find the requested view type %d",vt);
    return;
  }
  return;
}

Assistant:

void DataRefs::SetViewType(XPViewTypes vt)
{
    // search the view in the map of view types
    for (const mapViewTypesTy& mvt: MAP_VIEW_TYPES)
        if (mvt.e == vt) {
            XPLMCommandOnce(cmdXP[mvt.cr]);
            return;
        }
    LOG_MSG(logWARN, "Didn't find the requested view type %d", int(vt));
}